

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

IssuanceParameter *
cfd::core::ConfidentialTransaction::CalculateIssuanceValue
          (IssuanceParameter *__return_storage_ptr__,Txid *txid,uint32_t vout,bool is_blind,
          ByteData256 *contract_hash,ByteData256 *asset_entropy)

{
  ConfidentialAssetId *this;
  IssuanceParameter *pIVar1;
  bool bVar2;
  ConfidentialAssetId *this_00;
  ConfidentialAssetId asset;
  BlindFactor entropy;
  ConfidentialAssetId token;
  bool local_101;
  IssuanceParameter *local_100;
  undefined1 local_f8 [40];
  undefined1 local_d0 [80];
  undefined4 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  local_101 = is_blind;
  BlindFactor::BlindFactor(&__return_storage_ptr__->entropy);
  this = &__return_storage_ptr__->asset;
  local_100 = __return_storage_ptr__;
  ConfidentialAssetId::ConfidentialAssetId(this);
  this_00 = &__return_storage_ptr__->token;
  ConfidentialAssetId::ConfidentialAssetId(this_00);
  bVar2 = ByteData256::Equals(asset_entropy,(ByteData256 *)kEmptyByteData256);
  if (bVar2) {
    CalculateAssetEntropy((BlindFactor *)local_d0,txid,vout,contract_hash);
    if ((IssuanceParameter *)local_d0 != local_100) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &(local_100->entropy).data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_d0 + 8));
    }
    CalculateAsset((ConfidentialAssetId *)local_f8,(BlindFactor *)local_d0);
    pIVar1 = local_100;
    if (this != (ConfidentialAssetId *)local_f8) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(local_100->asset).data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_f8 + 8));
      (pIVar1->asset).version_ = local_f8[0x20];
    }
    CalculateReissuanceToken
              ((ConfidentialAssetId *)(local_d0 + 0x20),(BlindFactor *)local_d0,local_101);
    pIVar1 = local_100;
    if (this_00 != (ConfidentialAssetId *)(local_d0 + 0x20)) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(local_100->token).data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_d0 + 0x28));
      (pIVar1->token).version_ = local_d0[0x40];
    }
    local_d0._72_8_ = "cfdcore_elements_transaction.cpp";
    local_80 = 0x864;
    local_78 = "CalculateIssuanceValue";
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_50,this);
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_70,this_00);
    logger::log<std::__cxx11::string&,std::__cxx11::string&,bool&>
              ((CfdSourceLocation *)(local_d0 + 0x48),kCfdLogLevelInfo,
               "asset[{}] token[{}] is_blind[{}]",&local_50,&local_70,&local_101);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_d0._32_8_ = &PTR__ConfidentialAssetId_0025afe8;
    if ((pointer)local_d0._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_d0._40_8_);
    }
    local_f8._0_8_ = &PTR__ConfidentialAssetId_0025afe8;
    if ((pointer)local_f8._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._8_8_);
    }
    local_d0._0_8_ = &PTR__BlindFactor_0025b028;
  }
  else {
    BlindFactor::BlindFactor((BlindFactor *)local_f8,contract_hash);
    if ((IssuanceParameter *)local_f8 != local_100) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &(local_100->entropy).data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_f8 + 8));
    }
    local_f8._0_8_ = &PTR__BlindFactor_0025b028;
    if ((pointer)local_f8._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._8_8_);
    }
    CalculateAsset((ConfidentialAssetId *)local_f8,&local_100->entropy);
    pIVar1 = local_100;
    if (this != (ConfidentialAssetId *)local_f8) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(local_100->asset).data_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_f8 + 8));
      (pIVar1->asset).version_ = local_f8[0x20];
    }
    local_f8._0_8_ = &PTR__ConfidentialAssetId_0025afe8;
    local_d0._8_8_ = local_f8._8_8_;
  }
  if ((pointer)local_d0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_d0._8_8_);
  }
  return local_100;
}

Assistant:

IssuanceParameter ConfidentialTransaction::CalculateIssuanceValue(
    const Txid &txid, uint32_t vout, bool is_blind,
    const ByteData256 &contract_hash, const ByteData256 &asset_entropy) {
  IssuanceParameter result;

  if (!asset_entropy.Equals(kEmptyByteData256)) {
    // reissue
    result.entropy = BlindFactor(contract_hash);
    result.asset = CalculateAsset(
        result.entropy);  // ConfidentialAssetId(ByteData(asset));
    return result;
  }

  // calculate issue value
  const BlindFactor entropy = CalculateAssetEntropy(txid, vout, contract_hash);
  result.entropy = entropy;

  // calculate asset value
  const ConfidentialAssetId asset = CalculateAsset(entropy);
  result.asset = asset;

  // calculate token
  const ConfidentialAssetId token =
      CalculateReissuanceToken(entropy, is_blind);
  result.token = token;

  info(
      CFD_LOG_SOURCE, "asset[{}] token[{}] is_blind[{}]",
      result.asset.GetHex(), result.token.GetHex(), is_blind);
  return result;
}